

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

STRING_HANDLE STRING_new_JSON(char *source)

{
  LOGGER_LOG p_Var1;
  size_t sVar2;
  void *pvVar3;
  size_t local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  size_t pos;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t malloc_len;
  LOGGER_LOG l_1;
  size_t vlen;
  size_t nEscapeCharacters;
  size_t nControlCharacters;
  size_t i;
  LOGGER_LOG l;
  STRING *result;
  char *source_local;
  
  if (source == (char *)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                ,"STRING_new_JSON",0x108,1,"invalid arg (NULL)");
    }
  }
  else {
    nEscapeCharacters = 0;
    vlen = 0;
    sVar2 = strlen(source);
    for (nControlCharacters = 0;
        (nControlCharacters < sVar2 && ((byte)source[nControlCharacters] < 0x80));
        nControlCharacters = nControlCharacters + 1) {
      if (source[nControlCharacters] < ' ') {
        nEscapeCharacters = nEscapeCharacters + 1;
      }
      else if (((source[nControlCharacters] == '\"') || (source[nControlCharacters] == '\\')) ||
              (source[nControlCharacters] == '/')) {
        vlen = vlen + 1;
      }
    }
    if (nControlCharacters < sVar2) {
      l = (LOGGER_LOG)0x0;
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                  ,"STRING_new_JSON",300,1,"invalid character in input string");
      }
    }
    else {
      if (nEscapeCharacters == 0) {
        local_78 = 0;
      }
      else {
        if (nEscapeCharacters < 0x3333333333333334) {
          local_80 = nEscapeCharacters * 5;
        }
        else {
          local_80 = 0xffffffffffffffff;
        }
        local_78 = local_80;
      }
      if (local_78 < -sVar2 - 1) {
        local_88 = local_78 + sVar2;
      }
      else {
        local_88 = 0xffffffffffffffff;
      }
      if (local_88 < -vlen - 1) {
        local_90 = local_88 + vlen;
      }
      else {
        local_90 = 0xffffffffffffffff;
      }
      if (local_90 < 0xfffffffffffffffc) {
        local_98 = local_90 + 3;
      }
      else {
        local_98 = 0xffffffffffffffff;
      }
      if (local_98 == 0xffffffffffffffff) {
        l = (LOGGER_LOG)0x0;
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                    ,"STRING_new_JSON",0x139,1,"malloc len overflow");
        }
      }
      else {
        l = (LOGGER_LOG)malloc(8);
        if (l == (LOGGER_LOG)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                      ,"STRING_new_JSON",0x13e,1,"malloc json failure");
          }
        }
        else {
          pvVar3 = malloc(local_98);
          *(void **)l = pvVar3;
          if (pvVar3 == (void *)0x0) {
            free(l);
            l = (LOGGER_LOG)0x0;
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                        ,"STRING_new_JSON",0x145,1,"malloc failed");
            }
          }
          else {
            local_70 = 1;
            **(undefined1 **)l = 0x22;
            for (nControlCharacters = 0; nControlCharacters < sVar2;
                nControlCharacters = nControlCharacters + 1) {
              if ((source[nControlCharacters] < ' ') && (local_70 + 6 <= local_98)) {
                *(undefined1 *)(*(long *)l + local_70) = 0x5c;
                *(undefined1 *)(*(long *)l + local_70 + 1) = 0x75;
                *(undefined1 *)(*(long *)l + local_70 + 2) = 0x30;
                *(undefined1 *)(*(long *)l + local_70 + 3) = 0x30;
                *(char *)(*(long *)l + local_70 + 4) =
                     "0123456789ABCDEF"[(int)((int)source[nControlCharacters] & 0xf0U) >> 4];
                *(char *)(*(long *)l + local_70 + 5) =
                     "0123456789ABCDEF"[(int)((int)source[nControlCharacters] & 0xf)];
                local_70 = local_70 + 6;
              }
              else if ((source[nControlCharacters] == '\"') && (local_70 + 2 <= local_98)) {
                *(undefined1 *)(*(long *)l + local_70) = 0x5c;
                *(undefined1 *)(*(long *)l + local_70 + 1) = 0x22;
                local_70 = local_70 + 2;
              }
              else if ((source[nControlCharacters] == '\\') && (local_70 + 2 <= local_98)) {
                *(undefined1 *)(*(long *)l + local_70) = 0x5c;
                *(undefined1 *)(*(long *)l + local_70 + 1) = 0x5c;
                local_70 = local_70 + 2;
              }
              else if ((source[nControlCharacters] == '/') && (local_70 + 2 <= local_98)) {
                *(undefined1 *)(*(long *)l + local_70) = 0x5c;
                *(undefined1 *)(*(long *)l + local_70 + 1) = 0x2f;
                local_70 = local_70 + 2;
              }
              else {
                if (local_98 <= local_70) {
                  free(*(void **)l);
                  free(l);
                  l = (LOGGER_LOG)0x0;
                  break;
                }
                *(char *)(*(long *)l + local_70) = source[nControlCharacters];
                local_70 = local_70 + 1;
              }
            }
            if (local_70 + 1 < local_98) {
              *(undefined1 *)(*(long *)l + local_70) = 0x22;
              *(undefined1 *)(*(long *)l + local_70 + 1) = 0;
            }
            else {
              free(*(void **)l);
              free(l);
              l = (LOGGER_LOG)0x0;
            }
          }
        }
      }
    }
  }
  return (STRING_HANDLE)l;
}

Assistant:

STRING_HANDLE STRING_new_JSON(const char* source)
{
    STRING* result;
    if (source == NULL)
    {
        /*Codes_SRS_STRING_02_011: [If source is NULL then STRING_new_JSON shall return NULL.] */
        result = NULL;
        LogError("invalid arg (NULL)");
    }
    else
    {
        size_t i;
        size_t nControlCharacters = 0; /*counts how many characters are to be expanded from 1 character to \uxxxx (6 characters)*/
        size_t nEscapeCharacters = 0;
        size_t vlen = strlen(source);

        for (i = 0; i < vlen; i++)
        {
            /*Codes_SRS_STRING_02_014: [If any character has the value outside [1...127] then STRING_new_JSON shall fail and return NULL.] */
            if ((unsigned char)source[i] >= 128) /*this be a UNICODE character begin*/
            {
                break;
            }
            else
            {
                if (source[i] <= 0x1F)
                {
                    nControlCharacters++;
                }
                else if (
                    (source[i] == '"') ||
                    (source[i] == '\\') ||
                    (source[i] == '/')
                    )
                {
                    nEscapeCharacters++;
                }
            }
        }

        if (i < vlen)
        {
            result = NULL;
            LogError("invalid character in input string");
        }
        else
        {
            //size_t malloc_len = vlen + 5 * nControlCharacters + nEscapeCharacters + 3;
            size_t malloc_len = safe_multiply_size_t(5, nControlCharacters);
            malloc_len = safe_add_size_t(malloc_len, vlen);
            malloc_len = safe_add_size_t(malloc_len, nEscapeCharacters);
            malloc_len = safe_add_size_t(malloc_len, 3);

            if (malloc_len == SIZE_MAX)
            {
                result = NULL;
                LogError("malloc len overflow");
            }
            else if ((result = (STRING*)malloc(sizeof(STRING))) == NULL)
            {
                /*Codes_SRS_STRING_02_021: [If the complete JSON representation cannot be produced, then STRING_new_JSON shall fail and return NULL.] */
                LogError("malloc json failure");
            }
            else if ((result->s = (char*)malloc(malloc_len)) == NULL)
            {
                /*Codes_SRS_STRING_02_021: [If the complete JSON representation cannot be produced, then STRING_new_JSON shall fail and return NULL.] */
                free(result);
                result = NULL;
                LogError("malloc failed");
            }
            else
            {
                size_t pos = 0;
                /*Codes_SRS_STRING_02_012: [The string shall begin with the quote character.] */
                result->s[pos++] = '"';
                for (i = 0; i < vlen; i++)
                {
                    if ((source[i] <= 0x1F) && ((pos + 6) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_019: [If the character code is less than 0x20 then it shall be represented as \u00xx, where xx is the hex representation of the character code.]*/
                        result->s[pos++] = '\\';
                        result->s[pos++] = 'u';
                        result->s[pos++] = '0';
                        result->s[pos++] = '0';
                        result->s[pos++] = hexToASCII[(source[i] & 0xF0) >> 4]; /*high nibble*/
                        result->s[pos++] = hexToASCII[source[i] & 0x0F]; /*low nibble*/
                    }
                    else if ((source[i] == '"') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_016: [If the character is " (quote) then it shall be repsented as \".] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '"';
                    }
                    else if ((source[i] == '\\') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_017: [If the character is \ (backslash) then it shall represented as \\.] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '\\';
                    }
                    else if ((source[i] == '/') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_018: [If the character is / (slash) then it shall be represented as \/.] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '/';
                    }
                    else if (pos < malloc_len)
                    {
                        /*Codes_SRS_STRING_02_013: [The string shall copy the characters of source "as they are" (until the '\0' character) with the following exceptions:] */
                        result->s[pos++] = source[i];
                    }
                    else
                    {
                        free(result->s);
                        free(result);
                        result = NULL;
                        break;
                    }
                }

                if ((pos + 1) < malloc_len)
                {
                    /*Codes_SRS_STRING_02_020: [The string shall end with " (quote).] */
                    result->s[pos++] = '"';
                    /*zero terminating it*/
                    result->s[pos] = '\0';
                }
                else
                {
                    free(result->s);
                    free(result);
                    result = NULL;
                }
            }
        }

    }
    return (STRING_HANDLE)result;
}